

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecontroller.cpp
# Opt level: O1

void __thiscall IGameController::IGameController(IGameController *this,CGameContext *pGameServer)

{
  CConfig *pCVar1;
  IServer *pIVar2;
  int i;
  int iVar3;
  long lVar4;
  
  this->_vptr_IGameController = (_func_int **)&PTR_CanBeMovedOnBalance_001641d0;
  this->m_pGameServer = pGameServer;
  pCVar1 = pGameServer->m_pConfig;
  this->m_pConfig = pCVar1;
  pIVar2 = pGameServer->m_pServer;
  this->m_pServer = pIVar2;
  this->m_aTeamSize[0] = 0;
  this->m_aTeamSize[1] = 0;
  this->m_UnbalancedTick = -1;
  this->m_GameState = IGS_GAME_RUNNING;
  this->m_GameStateTimer = -1;
  this->m_GameStartTick = pIVar2->m_CurrentGameTick;
  this->m_MatchCount = 0;
  this->m_RoundCount = 0;
  this->m_SuddenDeath = 0;
  this->m_aTeamscore[0] = 0;
  this->m_aTeamscore[1] = 0;
  iVar3 = pCVar1->m_SvWarmup;
  if (iVar3 == 0) {
    this->m_GameState = IGS_WARMUP_GAME;
    this->m_GameStateTimer = -1;
    if ((this->m_GameFlags & 4) != 0) {
      lVar4 = 0;
      do {
        if (pGameServer->m_apPlayers[lVar4] != (CPlayer *)0x0) {
          pGameServer->m_apPlayers[lVar4]->m_RespawnDisabled = false;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x40);
    }
  }
  else {
    SetGameState(this,IGS_WARMUP_USER,iVar3);
  }
  this->m_GameFlags = 0;
  this->m_pGameType = "unknown";
  (this->m_GameInfo).m_MatchCurrent = this->m_MatchCount + 1;
  iVar3 = str_length(this->m_pConfig->m_SvMaprotation);
  if (iVar3 == 0) {
    iVar3 = 0;
  }
  else {
    iVar3 = this->m_pConfig->m_SvMatchesPerMap;
  }
  (this->m_GameInfo).m_MatchNum = iVar3;
  iVar3 = this->m_pConfig->m_SvTimelimit;
  (this->m_GameInfo).m_ScoreLimit = this->m_pConfig->m_SvScorelimit;
  (this->m_GameInfo).m_TimeLimit = iVar3;
  this->m_aMapWish[0] = '\0';
  this->m_aNumSpawnPoints[0] = 0;
  this->m_aNumSpawnPoints[1] = 0;
  this->m_aNumSpawnPoints[2] = 0;
  return;
}

Assistant:

IGameController::IGameController(CGameContext *pGameServer)
{
	m_pGameServer = pGameServer;
	m_pConfig = m_pGameServer->Config();
	m_pServer = m_pGameServer->Server();

	// balancing
	m_aTeamSize[TEAM_RED] = 0;
	m_aTeamSize[TEAM_BLUE] = 0;
	m_UnbalancedTick = TBALANCE_OK;

	// game
	m_GameState = IGS_GAME_RUNNING;
	m_GameStateTimer = TIMER_INFINITE;
	m_GameStartTick = Server()->Tick();
	m_MatchCount = 0;
	m_RoundCount = 0;
	m_SuddenDeath = 0;
	m_aTeamscore[TEAM_RED] = 0;
	m_aTeamscore[TEAM_BLUE] = 0;
	if(Config()->m_SvWarmup)
		SetGameState(IGS_WARMUP_USER, Config()->m_SvWarmup);
	else
		SetGameState(IGS_WARMUP_GAME, TIMER_INFINITE);

	// info
	m_GameFlags = 0;
	m_pGameType = "unknown";
	m_GameInfo.m_MatchCurrent = m_MatchCount+1;
	m_GameInfo.m_MatchNum = (str_length(Config()->m_SvMaprotation) && Config()->m_SvMatchesPerMap) ? Config()->m_SvMatchesPerMap : 0;
	m_GameInfo.m_ScoreLimit = Config()->m_SvScorelimit;
	m_GameInfo.m_TimeLimit = Config()->m_SvTimelimit;

	// map
	m_aMapWish[0] = 0;

	// spawn
	m_aNumSpawnPoints[0] = 0;
	m_aNumSpawnPoints[1] = 0;
	m_aNumSpawnPoints[2] = 0;
}